

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandShow(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Abc_Ntk_t *pNtk0;
  char *pcVar3;
  uint local_40;
  int fFlopDep;
  int fUseReverse;
  int fGateNames;
  int fSeq;
  int c;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pNtk0 = Abc_FrameReadNtk(pAbc);
  fUseReverse = 0;
  fFlopDep = 0;
  local_40 = 1;
  bVar1 = false;
  Extra_UtilGetoptReset();
  while (iVar2 = Extra_UtilGetopt(argc,argv,"rsgfh"), iVar2 != -1) {
    switch(iVar2) {
    case 0x66:
      bVar1 = (bool)(bVar1 ^ 1);
      break;
    case 0x67:
      fFlopDep = fFlopDep ^ 1;
      break;
    default:
      Abc_Print(-2,"usage: show [-srgfh]\n");
      Abc_Print(-2,"       visualizes the network structure using DOT and GSVIEW\n");
      pcVar3 = "no";
      if (fUseReverse != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-s    : toggles visualization of sequential networks [default = %s].\n",pcVar3
               );
      pcVar3 = "no";
      if (local_40 != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-r    : toggles ordering nodes in reverse order [default = %s].\n",pcVar3);
      pcVar3 = "no";
      if (fFlopDep != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-g    : toggles printing gate names for mapped network [default = %s].\n",
                pcVar3);
      pcVar3 = "no";
      if (bVar1) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-f    : toggles visualizing flop dependency graph [default = %s].\n",pcVar3);
      Abc_Print(-2,"\t-h    : print the command usage\n");
      return 1;
    case 0x72:
      local_40 = local_40 ^ 1;
      break;
    case 0x73:
      fUseReverse = fUseReverse ^ 1;
    }
  }
  if (pNtk0 == (Abc_Ntk_t *)0x0) {
    Abc_Print(-1,"Empty network.\n");
    pAbc_local._4_4_ = 1;
  }
  else {
    if (bVar1) {
      Abc_NtkShowFlopDependency(pNtk0);
    }
    else {
      Abc_NtkShow(pNtk0,fFlopDep,fUseReverse,local_40);
    }
    pAbc_local._4_4_ = 0;
  }
  return pAbc_local._4_4_;
}

Assistant:

int Abc_CommandShow( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c;
    int fSeq;
    int fGateNames;
    int fUseReverse;
    int fFlopDep;
    extern void Abc_NtkShow( Abc_Ntk_t * pNtk, int fGateNames, int fSeq, int fUseReverse );
    extern void Abc_NtkShowFlopDependency( Abc_Ntk_t * pNtk );

    // set defaults
    fSeq        = 0;
    fGateNames  = 0;
    fUseReverse = 1;
    fFlopDep    = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "rsgfh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'r':
            fUseReverse ^= 1;
            break;
        case 's':
            fSeq ^= 1;
            break;
        case 'g':
            fGateNames ^= 1;
            break;
        case 'f':
            fFlopDep ^= 1;
            break;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( fFlopDep )
        Abc_NtkShowFlopDependency( pNtk );
    else
        Abc_NtkShow( pNtk, fGateNames, fSeq, fUseReverse );
    return 0;

usage:
    Abc_Print( -2, "usage: show [-srgfh]\n" );
    Abc_Print( -2, "       visualizes the network structure using DOT and GSVIEW\n" );
#ifdef WIN32
    Abc_Print( -2, "       \"dot.exe\" and \"gsview32.exe\" should be set in the paths\n" );
    Abc_Print( -2, "       (\"gsview32.exe\" may be in \"C:\\Program Files\\Ghostgum\\gsview\\\")\n" );
#endif
    Abc_Print( -2, "\t-s    : toggles visualization of sequential networks [default = %s].\n", fSeq? "yes": "no" );
    Abc_Print( -2, "\t-r    : toggles ordering nodes in reverse order [default = %s].\n", fUseReverse? "yes": "no" );
    Abc_Print( -2, "\t-g    : toggles printing gate names for mapped network [default = %s].\n", fGateNames? "yes": "no" );
    Abc_Print( -2, "\t-f    : toggles visualizing flop dependency graph [default = %s].\n", fFlopDep? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}